

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Pin<kj::(anonymous_namespace)::Obj2>::~Pin(Pin<kj::(anonymous_namespace)::Obj2> *this)

{
  Pin<kj::(anonymous_namespace)::Obj2> *this_local;
  
  anon_unknown_0::Obj2::~Obj2(&this->t);
  return;
}

Assistant:

inline ~Pin() {
    // Destroy a Pin with underlying object.
    // Undefined behavior when live pointers exist, asserted when KJ_ASSERT_PTR_COUNTERS is defined.
#if KJ_ASSERT_PTR_COUNTERS
    ptrCounter.assertEmpty();
#endif
  }